

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O3

void __thiscall helics::udp::UdpComms::loadNetworkInfo(UdpComms *this,NetworkBrokerData *netInfo)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Ptr_type _Var3;
  bool bVar4;
  _Result<int> *__tmp;
  promise<int> local_58;
  promise<int> local_38;
  
  NetworkCommsInterface::loadNetworkInfo(&this->super_NetworkCommsInterface,netInfo);
  bVar4 = CommsInterface::propertyLock((CommsInterface *)this);
  if (bVar4) {
    std::promise<int>::promise(&local_38);
    _Var3._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl =
         local_38._M_storage._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
         .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl;
    _Var2._M_pi = local_38._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_38._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_38._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(__uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
            )0x0;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->promisePort)._M_future.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (this->promisePort)._M_future.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    (this->promisePort)._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->promisePort)._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    local_58._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(this->promisePort)._M_storage._M_t.
           super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
           .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl;
    (this->promisePort)._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl =
         (_Result<int> *)
         _Var3._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<int>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<int>_*,_std::__future_base::_Result_base::_Deleter>
         .super__Head_base<0UL,_std::__future_base::_Result<int>_*,_false>._M_head_impl;
    std::promise<int>::~promise(&local_58);
    std::promise<int>::~promise(&local_38);
    std::__basic_future<int>::__basic_future
              ((__basic_future<int> *)&local_58,&(this->promisePort)._M_future);
    _Var2._M_pi = local_58._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_58._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->futurePort).super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->futurePort).super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->futurePort).super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (local_58._M_future.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58._M_future.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    CommsInterface::propertyUnLock((CommsInterface *)this);
  }
  return;
}

Assistant:

void UdpComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    NetworkCommsInterface::loadNetworkInfo(netInfo);
    if (!propertyLock()) {
        return;
    }

    promisePort = std::promise<int>();
    futurePort = promisePort.get_future();

    propertyUnLock();
}